

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O3

void cuddCacheInsert2(DdManager *table,DD_CTFP op,DdNode *f,DdNode *g,DdNode *data)

{
  DdCache *pDVar1;
  uint uVar2;
  
  uVar2 = (((uint)g & 1) + *(int *)(((ulong)g & 0xfffffffffffffffe) + 0x20) * 2 +
          (((uint)f & 1) + *(int *)(((ulong)f & 0xfffffffffffffffe) + 0x20) * 2 + (int)op) *
          0xc00005) * 0x40f1f9;
  pDVar1 = table->cache + (int)(uVar2 >> ((byte)table->cacheShift & 0x1f));
  if (pDVar1->data != (DdNode *)0x0) {
    table->cachecollisions = table->cachecollisions + 1.0;
  }
  table->cacheinserts = table->cacheinserts + 1.0;
  pDVar1->f = f;
  pDVar1->g = g;
  pDVar1->h = (ptruint)op;
  pDVar1->data = data;
  pDVar1->hash = uVar2;
  return;
}

Assistant:

void
cuddCacheInsert2(
  DdManager * table,
  DD_CTFP op,
  DdNode * f,
  DdNode * g,
  DdNode * data)
{
    int posn;
    unsigned hash;
    register DdCache *entry;

    hash = ddCHash2_(op,cuddF2L(f),cuddF2L(g));
//    posn = ddCHash2(op,cuddF2L(f),cuddF2L(g),table->cacheShift);
    posn = hash >> table->cacheShift;
    entry = &table->cache[posn];

    if (entry->data != NULL) {
        table->cachecollisions++;
    }
    table->cacheinserts++;

    entry->f = f;
    entry->g = g;
    entry->h = (ptruint) op;
    entry->data = data;
#ifdef DD_CACHE_PROFILE
    entry->count++;
#endif
    entry->hash = hash;

}